

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# subdivision_geometry_device.cpp
# Opt level: O1

uint embree::addCube(RTCScene scene_i)

{
  undefined4 *puVar1;
  uint uVar2;
  undefined8 uVar3;
  long lVar4;
  long lVar5;
  
  uVar3 = rtcNewGeometry(g_device,8);
  lVar5 = 0;
  rtcSetSharedGeometryBuffer(uVar3,1,0,0x9003,cube_vertices,0,0x10,8);
  rtcSetSharedGeometryBuffer(uVar3,0,0,0x5001,cube_indices,0,4,0x18);
  rtcSetSharedGeometryBuffer(uVar3,0x10,0,0x5001,cube_faces,0,4,6);
  rtcSetGeometryVertexAttributeCount(uVar3,1);
  rtcSetSharedGeometryBuffer(uVar3,2,0,0x9003,cube_colors,0,0x10,8);
  lVar4 = rtcSetNewGeometryBuffer(uVar3,0x11,0,0x9001,4,0x18);
  do {
    puVar1 = (undefined4 *)(lVar4 + lVar5 * 4);
    *puVar1 = 0x43800000;
    puVar1[1] = 0x43800000;
    puVar1[2] = 0x43800000;
    puVar1[3] = 0x43800000;
    lVar5 = lVar5 + 4;
  } while (lVar5 != 0x18);
  rtcCommitGeometry(uVar3);
  uVar2 = rtcAttachGeometry(scene_i,uVar3);
  rtcReleaseGeometry(uVar3);
  return uVar2;
}

Assistant:

unsigned int addCube (RTCScene scene_i)
{
  /* create a triangulated cube with 6 quads and 8 vertices */
  RTCGeometry geom = rtcNewGeometry(g_device, RTC_GEOMETRY_TYPE_SUBDIVISION);

  rtcSetSharedGeometryBuffer(geom, RTC_BUFFER_TYPE_VERTEX, 0, RTC_FORMAT_FLOAT3, cube_vertices, 0, sizeof(Vec3fa), 8);
  rtcSetSharedGeometryBuffer(geom, RTC_BUFFER_TYPE_INDEX, 0, RTC_FORMAT_UINT, cube_indices, 0, sizeof(unsigned int), NUM_INDICES);
  rtcSetSharedGeometryBuffer(geom, RTC_BUFFER_TYPE_FACE, 0, RTC_FORMAT_UINT, cube_faces, 0, sizeof(unsigned int), NUM_FACES);

  /* edge and vertex creases disabled */
#if 0  
  rtcSetSharedGeometryBuffer(geom, RTC_BUFFER_TYPE_EDGE_CREASE_INDEX,    0, RTC_FORMAT_UINT2, cube_edge_crease_indices,   0, 2*sizeof(unsigned int), 12);
  rtcSetSharedGeometryBuffer(geom, RTC_BUFFER_TYPE_EDGE_CREASE_WEIGHT,   0, RTC_FORMAT_FLOAT, cube_edge_crease_weights,   0, sizeof(float), 12);
  rtcSetSharedGeometryBuffer(geom, RTC_BUFFER_TYPE_VERTEX_CREASE_INDEX,  0, RTC_FORMAT_UINT,  cube_vertex_crease_indices, 0, sizeof(unsigned int), 8);
  rtcSetSharedGeometryBuffer(geom, RTC_BUFFER_TYPE_VERTEX_CREASE_WEIGHT, 0, RTC_FORMAT_FLOAT, cube_vertex_crease_weights, 0, sizeof(float), 8);
#endif
  
  rtcSetGeometryVertexAttributeCount(geom,1);
  rtcSetSharedGeometryBuffer(geom, RTC_BUFFER_TYPE_VERTEX_ATTRIBUTE, 0, RTC_FORMAT_FLOAT3, cube_colors, 0, sizeof(Vec3fa), 8);

  float* level = (float*) rtcSetNewGeometryBuffer(geom, RTC_BUFFER_TYPE_LEVEL, 0, RTC_FORMAT_FLOAT, sizeof(float), NUM_INDICES);
  for (unsigned int i=0; i<NUM_INDICES; i++)
    level[i] = EDGE_LEVEL;

  rtcCommitGeometry(geom);
  unsigned int geomID = rtcAttachGeometry(scene_i, geom);
  rtcReleaseGeometry(geom);
  return geomID;
}